

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppManipulatingWindowTitle(bool *param_1)

{
  char cVar1;
  uint uVar2;
  float fVar3;
  ImVec2 local_b0;
  char local_a8 [8];
  char buf [128];
  ImVec2 local_20;
  ImVec2 local_18;
  bool *local_10;
  bool *param_0_local;
  
  local_10 = param_1;
  ImVec2::ImVec2(&local_18,100.0,100.0);
  ImGui::SetNextWindowPos(&local_18,4);
  ImGui::Begin("Same title as another window##1",(bool *)0x0,0);
  ImGui::Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
  ImGui::End();
  ImVec2::ImVec2(&local_20,100.0,200.0);
  ImGui::SetNextWindowPos(&local_20,4);
  ImGui::Begin("Same title as another window##2",(bool *)0x0,0);
  ImGui::Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
  ImGui::End();
  fVar3 = ImGui::GetTime();
  cVar1 = "|/-\\"[(int)((int)(fVar3 / 0.25) & 3)];
  uVar2 = rand();
  sprintf(local_a8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1,(ulong)uVar2);
  ImVec2::ImVec2(&local_b0,100.0,300.0);
  ImGui::SetNextWindowPos(&local_b0,4);
  ImGui::Begin(local_a8,(bool *)0x0,0);
  ImGui::Text("This window has a changing title.");
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppManipulatingWindowTitle(bool*)
{
    // By default, Windows are uniquely identified by their title.
    // You can use the "##" and "###" markers to manipulate the display/ID.

    // Using "##" to display same title but have unique identifier.
    ImGui::SetNextWindowPos(ImVec2(100,100), ImGuiCond_FirstUseEver);
    ImGui::Begin("Same title as another window##1");
    ImGui::Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    ImGui::End();

    ImGui::SetNextWindowPos(ImVec2(100,200), ImGuiCond_FirstUseEver);
    ImGui::Begin("Same title as another window##2");
    ImGui::Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    ImGui::End();

    // Using "###" to display a changing title but keep a static identifier "AnimatedTitle"
    char buf[128];
    sprintf(buf, "Animated title %c %d###AnimatedTitle", "|/-\\"[(int)(ImGui::GetTime()/0.25f)&3], rand());
    ImGui::SetNextWindowPos(ImVec2(100,300), ImGuiCond_FirstUseEver);
    ImGui::Begin(buf);
    ImGui::Text("This window has a changing title.");
    ImGui::End();
}